

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_state_capability_resp(connectdata *conn,int imapcode,imapstate instate)

{
  SessionHandle *data_00;
  int iVar1;
  bool bVar2;
  ulong local_40;
  size_t wordlen;
  char *line;
  imap_conn *imapc;
  SessionHandle *data;
  CURLcode result;
  imapstate instate_local;
  int imapcode_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  data_00 = conn->data;
  if (imapcode == 0x2a) {
    wordlen = (size_t)((data_00->state).buffer + 2);
    while( true ) {
      while( true ) {
        bVar2 = false;
        if ((((*(char *)wordlen != '\0') && (bVar2 = true, *(char *)wordlen != ' ')) &&
            (bVar2 = true, *(char *)wordlen != '\t')) && (bVar2 = true, *(char *)wordlen != '\r')) {
          bVar2 = *(char *)wordlen == '\n';
        }
        if (!bVar2) break;
        wordlen = wordlen + 1;
      }
      if (*(char *)wordlen == '\0') break;
      local_40 = 0;
      while( true ) {
        bVar2 = false;
        if (((*(char *)(wordlen + local_40) != '\0') &&
            (bVar2 = false, *(char *)(wordlen + local_40) != ' ')) &&
           ((bVar2 = false, *(char *)(wordlen + local_40) != '\t' &&
            (bVar2 = false, *(char *)(wordlen + local_40) != '\r')))) {
          bVar2 = *(char *)(wordlen + local_40) != '\n';
        }
        if (!bVar2) break;
        local_40 = local_40 + 1;
      }
      if ((local_40 == 8) && (*(long *)wordlen == 0x534c545452415453)) {
        (conn->proto).ftpc.ctl_valid = true;
      }
      else if ((local_40 == 0xd) &&
              (iVar1 = memcmp((void *)wordlen,"LOGINDISABLED",0xd), iVar1 == 0)) {
        (conn->proto).ftpc.cwddone = true;
      }
      else if ((local_40 == 7) && (iVar1 = memcmp((void *)wordlen,"SASL-IR",7), iVar1 == 0)) {
        (conn->proto).ftpc.cwdfail = true;
      }
      else if ((5 < local_40) && (iVar1 = memcmp((void *)wordlen,"AUTH=",5), iVar1 == 0)) {
        wordlen = wordlen + 5;
        local_40 = local_40 - 5;
        if ((local_40 == 5) && (iVar1 = memcmp((void *)wordlen,"LOGIN",5), iVar1 == 0)) {
          (conn->proto).imapc.authmechs = (conn->proto).imapc.authmechs | 1;
        }
        else if ((local_40 == 5) && (iVar1 = memcmp((void *)wordlen,"PLAIN",5), iVar1 == 0)) {
          (conn->proto).imapc.authmechs = (conn->proto).imapc.authmechs | 2;
        }
        else if ((local_40 == 8) && (iVar1 = memcmp((void *)wordlen,"CRAM-MD5",8), iVar1 == 0)) {
          (conn->proto).imapc.authmechs = (conn->proto).imapc.authmechs | 4;
        }
        else if ((local_40 == 10) && (iVar1 = memcmp((void *)wordlen,"DIGEST-MD5",10), iVar1 == 0))
        {
          (conn->proto).imapc.authmechs = (conn->proto).imapc.authmechs | 8;
        }
        else if ((local_40 == 6) && (iVar1 = memcmp((void *)wordlen,"GSSAPI",6), iVar1 == 0)) {
          (conn->proto).imapc.authmechs = (conn->proto).imapc.authmechs | 0x10;
        }
        else if ((local_40 == 8) && (iVar1 = memcmp((void *)wordlen,"EXTERNAL",8), iVar1 == 0)) {
          (conn->proto).imapc.authmechs = (conn->proto).imapc.authmechs | 0x20;
        }
        else if ((local_40 == 4) && (iVar1 = memcmp((void *)wordlen,"NTLM",4), iVar1 == 0)) {
          (conn->proto).imapc.authmechs = (conn->proto).imapc.authmechs | 0x40;
        }
        else if ((local_40 == 7) && (iVar1 = memcmp((void *)wordlen,"XOAUTH2",7), iVar1 == 0)) {
          (conn->proto).imapc.authmechs = (conn->proto).imapc.authmechs | 0x80;
        }
      }
      wordlen = local_40 + wordlen;
    }
  }
  else if (imapcode == 0x4f) {
    if (((data_00->set).use_ssl == CURLUSESSL_NONE) || ((conn->ssl[0].use & 1U) != 0)) {
      data._4_4_ = imap_perform_authentication(conn);
    }
    else if (((conn->proto).ftpc.ctl_valid & 1U) == 0) {
      if ((data_00->set).use_ssl == CURLUSESSL_TRY) {
        data._4_4_ = imap_perform_authentication(conn);
      }
      else {
        Curl_failf(data_00,"STARTTLS not supported.");
        data._4_4_ = CURLE_USE_SSL_FAILED;
      }
    }
    else {
      data._4_4_ = imap_perform_starttls(conn);
    }
  }
  else {
    data._4_4_ = imap_perform_authentication(conn);
  }
  return data._4_4_;
}

Assistant:

static CURLcode imap_state_capability_resp(struct connectdata *conn,
                                           int imapcode,
                                           imapstate instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct imap_conn *imapc = &conn->proto.imapc;
  const char *line = data->state.buffer;
  size_t wordlen;

  (void)instate; /* no use for this yet */

  /* Do we have a untagged response? */
  if(imapcode == '*') {
    line += 2;

    /* Loop through the data line */
    for(;;) {
      while(*line &&
            (*line == ' ' || *line == '\t' ||
              *line == '\r' || *line == '\n')) {

        line++;
      }

      if(!*line)
        break;

      /* Extract the word */
      for(wordlen = 0; line[wordlen] && line[wordlen] != ' ' &&
            line[wordlen] != '\t' && line[wordlen] != '\r' &&
            line[wordlen] != '\n';)
        wordlen++;

      /* Does the server support the STARTTLS capability? */
      if(wordlen == 8 && !memcmp(line, "STARTTLS", 8))
        imapc->tls_supported = TRUE;

      /* Has the server explicitly disabled clear text authentication? */
      else if(wordlen == 13 && !memcmp(line, "LOGINDISABLED", 13))
        imapc->login_disabled = TRUE;

      /* Does the server support the SASL-IR capability? */
      else if(wordlen == 7 && !memcmp(line, "SASL-IR", 7))
        imapc->ir_supported = TRUE;

      /* Do we have a SASL based authentication mechanism? */
      else if(wordlen > 5 && !memcmp(line, "AUTH=", 5)) {
        line += 5;
        wordlen -= 5;

        /* Test the word for a matching authentication mechanism */
        if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_LOGIN))
          imapc->authmechs |= SASL_MECH_LOGIN;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_PLAIN))
          imapc->authmechs |= SASL_MECH_PLAIN;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_CRAM_MD5))
          imapc->authmechs |= SASL_MECH_CRAM_MD5;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_DIGEST_MD5))
          imapc->authmechs |= SASL_MECH_DIGEST_MD5;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_GSSAPI))
          imapc->authmechs |= SASL_MECH_GSSAPI;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_EXTERNAL))
          imapc->authmechs |= SASL_MECH_EXTERNAL;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_NTLM))
          imapc->authmechs |= SASL_MECH_NTLM;
        else if(sasl_mech_equal(line, wordlen, SASL_MECH_STRING_XOAUTH2))
          imapc->authmechs |= SASL_MECH_XOAUTH2;
      }

      line += wordlen;
    }
  }
  else if(imapcode == 'O') {
    if(data->set.use_ssl && !conn->ssl[FIRSTSOCKET].use) {
      /* We don't have a SSL/TLS connection yet, but SSL is requested */
      if(imapc->tls_supported)
        /* Switch to TLS connection now */
        result = imap_perform_starttls(conn);
      else if(data->set.use_ssl == CURLUSESSL_TRY)
        /* Fallback and carry on with authentication */
        result = imap_perform_authentication(conn);
      else {
        failf(data, "STARTTLS not supported.");
        result = CURLE_USE_SSL_FAILED;
      }
    }
    else
      result = imap_perform_authentication(conn);
  }
  else
    result = imap_perform_authentication(conn);

  return result;
}